

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O0

void cli::anon_unknown_2::addDirectory(ArchiveBuilder *archive,string *path,bool recursive)

{
  string *archive_00;
  int iVar1;
  char *__name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  dirent *local_30;
  dirent *ent;
  DIR *dir;
  string *psStack_18;
  bool recursive_local;
  string *path_local;
  ArchiveBuilder *archive_local;
  
  dir._7_1_ = recursive;
  psStack_18 = path;
  path_local = (string *)archive;
  __name = (char *)std::__cxx11::string::c_str();
  ent = (dirent *)opendir(__name);
  if (ent != (dirent *)0x0) {
    while (local_30 = readdir((DIR *)ent), local_30 != (dirent *)0x0) {
      iVar1 = strcmp(local_30->d_name,".");
      if ((iVar1 != 0) &&
         (iVar1 = strcmp(local_30->d_name,".."), archive_00 = path_local, iVar1 != 0)) {
        if (local_30->d_type == '\x04') {
          if ((dir._7_1_ & 1) != 0) {
            std::operator+(&local_70,psStack_18,'/');
            std::operator+(&local_50,&local_70,local_30->d_name);
            addDirectory((ArchiveBuilder *)archive_00,&local_50,(bool)(dir._7_1_ & 1));
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_70);
          }
        }
        else {
          std::operator+(&local_c0,psStack_18,'/');
          std::operator+(&local_a0,&local_c0,local_30->d_name);
          addPath((ArchiveBuilder *)archive_00,&local_a0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
      }
    }
    closedir((DIR *)ent);
  }
  return;
}

Assistant:

void addDirectory(ZAP::ArchiveBuilder &archive, const std::string &path, bool recursive)
		{
		#ifdef _WIN32
			HANDLE dir;
			WIN32_FIND_DATAA ent;

			if ((dir = FindFirstFileA((path + "/*").c_str(), &ent)) != INVALID_HANDLE_VALUE)
			{
				do
				{
					if ((std::strcmp(ent.cFileName, ".") == 0) || (std::strcmp(ent.cFileName, "..") == 0))
						continue;

					if (ent.dwFileAttributes & FILE_ATTRIBUTE_DIRECTORY)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent.cFileName, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent.cFileName);
					}
				} while (FindNextFileA(dir, &ent));

				FindClose(dir);
			}
		#else
			DIR *dir;
			struct dirent *ent;

			if ((dir = opendir(path.c_str())) != nullptr)
			{
				while ((ent = readdir(dir)) != nullptr)
				{
					if ((std::strcmp(ent->d_name, ".") == 0) || (std::strcmp(ent->d_name, "..") == 0))
						continue;

					if (ent->d_type == DT_DIR)
					{
						if (recursive)
							addDirectory(archive, path + '/' + ent->d_name, recursive);
					}
					else
					{
						addPath(archive, path + '/' + ent->d_name);
					}
				}

				closedir(dir);
			}
		#endif
		}